

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondStamp.cpp
# Opt level: O2

void __thiscall OpenMD::BondStamp::BondStamp(BondStamp *this)

{
  allocator<char> local_69;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  size_type local_60;
  char local_58 [8];
  undefined8 uStack_50;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  local_48;
  
  DataHolder::DataHolder(&this->super_DataHolder);
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__BondStamp_002bffa0;
  (this->BondOrder).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->BondOrder).super_ParameterBase.keyword_.field_2;
  (this->BondOrder).super_ParameterBase.keyword_._M_string_length = 0;
  (this->BondOrder).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->BondOrder).super_ParameterBase.optional_ = false;
  (this->BondOrder).super_ParameterBase.defaultValue_ = false;
  (this->BondOrder).super_ParameterBase.empty_ = true;
  (this->BondOrder).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002bd550;
  this->hasOverride_ = false;
  (this->orType_)._M_dataplus._M_p = (pointer)&(this->orType_).field_2;
  (this->orType_)._M_string_length = 0;
  (this->orType_).field_2._M_local_buf[0] = '\0';
  (this->orPars_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->orPars_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->orPars_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"bondOrder",(allocator<char> *)&local_68);
  std::__cxx11::string::_M_assign((string *)&(this->BondOrder).super_ParameterBase.keyword_);
  std::__cxx11::string::~string((string *)&local_48);
  (this->BondOrder).super_ParameterBase.optional_ = true;
  (this->BondOrder).super_ParameterBase.defaultValue_ = true;
  (this->BondOrder).data_ = 1.0;
  (this->BondOrder).super_ParameterBase.empty_ = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"bondOrder",&local_69);
  local_48.first._M_string_length = local_60;
  local_48.first._M_dataplus._M_p = (pointer)&local_48.first.field_2;
  if (local_68 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58) {
    local_48.first.field_2._8_8_ = uStack_50;
  }
  else {
    local_48.first._M_dataplus._M_p = (pointer)local_68;
  }
  local_60 = 0;
  local_58[0] = '\0';
  local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_58;
  local_48.second = &(this->BondOrder).super_ParameterBase;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)&(this->super_DataHolder).parameters_,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

BondStamp::BondStamp() : hasOverride_(false) {
    DefineOptionalParameterWithDefaultValue(BondOrder, "bondOrder", 1);
  }